

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CType *stm)

{
  mapped_type *__rhs;
  pointer pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  CType *local_18;
  CType *stm_local;
  CConvertVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CType *)this;
  if ((stm->isPrimitive & 1U) == 0) {
    pCVar1 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->name);
    (**(pCVar1->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar1,this);
    std::__cxx11::string::operator+=((string *)&this->code," ");
  }
  else {
    __rhs = std::
            map<enums::TPrimitiveType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TPrimitiveType>,_std::allocator<std::pair<const_enums::TPrimitiveType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&CType::typeNames_abi_cxx11_,&stm->type);
    std::operator+(local_38,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)&this->code,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CType &stm) {
	if (stm.isPrimitive) {
		this->code += CType::typeNames[stm.type] + " ";
	} else {
		stm.name->Accept(*this);
		this->code += " ";
	}
}